

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_triangle_strip(rf_vec2 *points,int points_count,rf_color color)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (2 < points_count) {
    prVar1 = (rf__ctx->field_0).current_batch;
    lVar2 = prVar1->current_buffer;
    prVar3 = prVar1->vertex_buffers;
    if (prVar3[lVar2].elements_count * 4 <= prVar3[lVar2].v_counter + points_count) {
      rf_gfx_draw();
    }
    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r,color.g,color.b,color.a);
    uVar6 = 2;
    do {
      rf_gfx_vertex3f(points[uVar6].x,points[uVar6].y,
                      ((rf__ctx->field_0).current_batch)->current_depth);
      uVar4 = (ulong)(uint)((int)uVar6 * 8);
      uVar5 = (ulong)((uVar6 & 1) == 0) << 3;
      rf_gfx_vertex3f(*(float *)((long)&points[uVar6].x + (uVar4 | 0xfffffffffffffff0)),
                      *(float *)((long)&points[uVar6].x + (uVar4 | 0xfffffffffffffff4)),
                      ((rf__ctx->field_0).current_batch)->current_depth);
      rf_gfx_vertex3f(*(float *)((long)&points[uVar6].x + (uVar5 | 0xfffffffffffffff0)),
                      *(float *)((long)&points[uVar6].x + (uVar5 | 0xfffffffffffffff4)),
                      ((rf__ctx->field_0).current_batch)->current_depth);
      uVar6 = uVar6 + 1;
    } while ((uint)points_count != uVar6);
    rf_gfx_end();
    return;
  }
  return;
}

Assistant:

RF_API void rf_draw_triangle_strip(rf_vec2 *points, int points_count, rf_color color)
{
    if (points_count >= 3)
    {
        if (rf_gfx_check_buffer_limit(points_count)) rf_gfx_draw();

        rf_gfx_begin(RF_TRIANGLES);
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        for (rf_int i = 2; i < points_count; i++)
        {
            if ((i%2) == 0)
            {
                rf_gfx_vertex2f(points[i].x, points[i].y);
                rf_gfx_vertex2f(points[i - 2].x, points[i - 2].y);
                rf_gfx_vertex2f(points[i - 1].x, points[i - 1].y);
            }
            else
            {
                rf_gfx_vertex2f(points[i].x, points[i].y);
                rf_gfx_vertex2f(points[i - 1].x, points[i - 1].y);
                rf_gfx_vertex2f(points[i - 2].x, points[i - 2].y);
            }
        }
        rf_gfx_end();
    }
}